

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap_str.c
# Opt level: O3

char * ap_str_trim_head_from_set(char *str,char *set)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  char *__s;
  
  if (set != (char *)0x0 && str != (char *)0x0) {
    sVar1 = strlen(str);
    sVar2 = strlen(set);
    if (sVar2 != 0 && sVar1 != 0) {
      sVar4 = 0;
      pcVar3 = str;
      do {
        __s = pcVar3;
        sVar5 = 0;
        while (str[sVar4] != set[sVar5]) {
          sVar5 = sVar5 + 1;
          if (sVar2 == sVar5) goto LAB_001035aa;
        }
        pcVar3 = __s + 1;
        sVar4 = sVar4 + 1;
        __s = str + sVar1;
      } while (sVar4 != sVar1);
LAB_001035aa:
      if (str < __s) {
        sVar1 = strlen(__s);
        pcVar3 = (char *)memmove(str,__s,sVar1 + 1);
        return pcVar3;
      }
    }
  }
  return str;
}

Assistant:

char * ap_str_trim_head_from_set (char *str, const char *set)
{
	size_t			str_len;
	size_t			set_len;
	size_t			i;
	size_t			j;
	char			*p				= NULL;
	unsigned int	found			= 0;

	if (str == NULL || set == NULL)
	{
		goto finish;
	}

	str_len = strlen (str);
	set_len = strlen (set);

	if (str_len == 0 || set_len == 0)
	{
		goto finish;
	}

	p = str;

	for (i = 0; i < str_len; i ++)
	{
		found = 0;

		for (j = 0; j < set_len; j ++)
		{
			if (str[i] == set[j])
			{
				found = 1;
				p ++;

				break;
			}
		}

		if (found == 0)
		{
			break;
		}
	}

	if (p > str)
	{
		str_len = strlen (p);
		memmove (str, p, str_len + 1);
	}

finish:
	return str;
}